

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
::rehash(sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
  *pSVar1;
  EntryPointer begin;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int8_t iVar30;
  sherwood_v3_entry<const_slang::syntax::SyntaxNode_*> *result;
  size_t sVar31;
  ulong uVar32;
  sherwood_v3_entry<const_slang::syntax::SyntaxNode_*> *psVar33;
  sherwood_v3_entry<const_slang::syntax::SyntaxNode_*> *psVar34;
  long lVar35;
  byte bVar36;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>_3 *key;
  ulong uVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar63;
  int iVar64;
  undefined1 auVar61 [16];
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  ulong local_38;
  
  auVar40._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_elements);
  auVar40._8_4_ = (int)(this->num_elements >> 0x20);
  auVar40._12_4_ = 0x45300000;
  auVar41._0_8_ = (double)this->_max_load_factor;
  auVar41._8_8_ = 0;
  dVar38 = ceil(((auVar40._8_8_ - 1.9342813113834067e+25) + (auVar40._0_8_ - 4503599627370496.0)) /
                auVar41._0_8_);
  local_38 = (long)(dVar38 - 9.223372036854776e+18) & (long)dVar38 >> 0x3f | (long)dVar38;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 == 0) {
    reset_to_empty_state(this);
    return;
  }
  iVar30 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
  sVar31 = this->num_slots_minus_one;
  if (sVar31 != 0) {
    sVar31 = sVar31 + 1;
  }
  if (local_38 != sVar31) {
    uVar32 = local_38 >> 1 | local_38;
    uVar32 = uVar32 >> 2 | uVar32;
    uVar32 = uVar32 >> 4 | uVar32;
    uVar32 = uVar32 >> 8 | uVar32;
    uVar32 = uVar32 >> 0x10 | uVar32;
    uVar32 = uVar32 >> 0x20 | uVar32;
    bVar36 = 4;
    if ('\x04' < (char)log2(unsigned_long)::table
                       [(uVar32 - (uVar32 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
      bVar36 = log2(unsigned_long)::table[(uVar32 - (uVar32 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
    }
    uVar32 = local_38 + bVar36;
    pSVar1 = (this->
             super_StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
             ).storage;
    psVar33 = pSVar1->ptr;
    if (8U - ((long)psVar33 - (long)pSVar1 >> 4) < uVar32) {
      psVar33 = (sherwood_v3_entry<const_slang::syntax::SyntaxNode_*> *)operator_new(uVar32 * 0x10);
    }
    else {
      pSVar1->ptr = psVar33 + uVar32;
    }
    auVar29 = _DAT_003e7450;
    auVar28 = _DAT_003e7440;
    auVar27 = _DAT_003e7430;
    auVar26 = _DAT_003e7420;
    auVar25 = _DAT_003e7410;
    auVar24 = _DAT_003e7400;
    auVar40 = _DAT_003e64d0;
    if (psVar33 != psVar33 + local_38 + ((ulong)bVar36 - 1)) {
      uVar37 = bVar36 + local_38 + 0xffffffffffffffe;
      uVar32 = uVar37 & 0xfffffffffffffff;
      auVar39._8_4_ = (int)uVar32;
      auVar39._0_8_ = uVar32;
      auVar39._12_4_ = (int)(uVar32 >> 0x20);
      psVar34 = psVar33 + 0xf;
      lVar35 = 0;
      do {
        auVar58._8_4_ = (int)lVar35;
        auVar58._0_8_ = lVar35;
        auVar58._12_4_ = (int)((ulong)lVar35 >> 0x20);
        auVar61 = auVar39 ^ auVar40;
        auVar66 = (auVar58 | auVar29) ^ auVar40;
        iVar60 = auVar61._0_4_;
        iVar79 = -(uint)(iVar60 < auVar66._0_4_);
        iVar63 = auVar61._4_4_;
        auVar68._4_4_ = -(uint)(iVar63 < auVar66._4_4_);
        iVar64 = auVar61._8_4_;
        iVar83 = -(uint)(iVar64 < auVar66._8_4_);
        iVar65 = auVar61._12_4_;
        auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
        auVar42._4_4_ = iVar79;
        auVar42._0_4_ = iVar79;
        auVar42._8_4_ = iVar83;
        auVar42._12_4_ = iVar83;
        auVar41 = pshuflw(auVar41,auVar42,0xe8);
        auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar63);
        auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar66 = pshuflw(in_XMM2,auVar67,0xe8);
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        auVar42 = pshuflw(auVar41,auVar68,0xe8);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar61 = (auVar42 | auVar66 & auVar41) ^ auVar61;
        auVar41 = packssdw(auVar61,auVar61);
        if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar34[-0xf].distance_from_desired = -1;
        }
        auVar11._4_4_ = iVar79;
        auVar11._0_4_ = iVar79;
        auVar11._8_4_ = iVar83;
        auVar11._12_4_ = iVar83;
        auVar68 = auVar67 & auVar11 | auVar68;
        auVar41 = packssdw(auVar68,auVar68);
        auVar66._8_4_ = 0xffffffff;
        auVar66._0_8_ = 0xffffffffffffffff;
        auVar66._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41 ^ auVar66,auVar41 ^ auVar66);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._0_4_ >> 8 & 1) != 0) {
          psVar34[-0xe].distance_from_desired = -1;
        }
        auVar41 = (auVar58 | auVar28) ^ auVar40;
        auVar51._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
        auVar51._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
        auVar51._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
        auVar51._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
        auVar69._4_4_ = auVar51._0_4_;
        auVar69._0_4_ = auVar51._0_4_;
        auVar69._8_4_ = auVar51._8_4_;
        auVar69._12_4_ = auVar51._8_4_;
        iVar79 = -(uint)(auVar41._4_4_ == iVar63);
        iVar83 = -(uint)(auVar41._12_4_ == iVar65);
        auVar12._4_4_ = iVar79;
        auVar12._0_4_ = iVar79;
        auVar12._8_4_ = iVar83;
        auVar12._12_4_ = iVar83;
        auVar80._4_4_ = auVar51._4_4_;
        auVar80._0_4_ = auVar51._4_4_;
        auVar80._8_4_ = auVar51._12_4_;
        auVar80._12_4_ = auVar51._12_4_;
        auVar41 = auVar12 & auVar69 | auVar80;
        auVar41 = packssdw(auVar41,auVar41);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41 ^ auVar2,auVar41 ^ auVar2);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
          psVar34[-0xd].distance_from_desired = -1;
        }
        auVar41 = pshufhw(auVar41,auVar69,0x84);
        auVar13._4_4_ = iVar79;
        auVar13._0_4_ = iVar79;
        auVar13._8_4_ = iVar83;
        auVar13._12_4_ = iVar83;
        auVar42 = pshufhw(auVar51,auVar13,0x84);
        auVar61 = pshufhw(auVar41,auVar80,0x84);
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar43 = (auVar61 | auVar42 & auVar41) ^ auVar43;
        auVar41 = packssdw(auVar43,auVar43);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._0_4_ >> 0x18 & 1) != 0) {
          psVar34[-0xc].distance_from_desired = -1;
        }
        auVar41 = (auVar58 | auVar27) ^ auVar40;
        auVar52._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
        auVar52._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
        auVar52._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
        auVar52._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
        auVar14._4_4_ = auVar52._0_4_;
        auVar14._0_4_ = auVar52._0_4_;
        auVar14._8_4_ = auVar52._8_4_;
        auVar14._12_4_ = auVar52._8_4_;
        auVar42 = pshuflw(auVar80,auVar14,0xe8);
        auVar44._0_4_ = -(uint)(auVar41._0_4_ == iVar60);
        auVar44._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
        auVar44._8_4_ = -(uint)(auVar41._8_4_ == iVar64);
        auVar44._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
        auVar70._4_4_ = auVar44._4_4_;
        auVar70._0_4_ = auVar44._4_4_;
        auVar70._8_4_ = auVar44._12_4_;
        auVar70._12_4_ = auVar44._12_4_;
        auVar41 = pshuflw(auVar44,auVar70,0xe8);
        auVar71._4_4_ = auVar52._4_4_;
        auVar71._0_4_ = auVar52._4_4_;
        auVar71._8_4_ = auVar52._12_4_;
        auVar71._12_4_ = auVar52._12_4_;
        auVar61 = pshuflw(auVar52,auVar71,0xe8);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41 & auVar42,(auVar61 | auVar41 & auVar42) ^ auVar3);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar34[-0xb].distance_from_desired = -1;
        }
        auVar15._4_4_ = auVar52._0_4_;
        auVar15._0_4_ = auVar52._0_4_;
        auVar15._8_4_ = auVar52._8_4_;
        auVar15._12_4_ = auVar52._8_4_;
        auVar71 = auVar70 & auVar15 | auVar71;
        auVar61 = packssdw(auVar71,auVar71);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41,auVar61 ^ auVar4);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._4_2_ >> 8 & 1) != 0) {
          psVar34[-10].distance_from_desired = -1;
        }
        auVar41 = (auVar58 | auVar26) ^ auVar40;
        auVar53._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
        auVar53._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
        auVar53._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
        auVar53._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
        auVar72._4_4_ = auVar53._0_4_;
        auVar72._0_4_ = auVar53._0_4_;
        auVar72._8_4_ = auVar53._8_4_;
        auVar72._12_4_ = auVar53._8_4_;
        iVar79 = -(uint)(auVar41._4_4_ == iVar63);
        iVar83 = -(uint)(auVar41._12_4_ == iVar65);
        auVar16._4_4_ = iVar79;
        auVar16._0_4_ = iVar79;
        auVar16._8_4_ = iVar83;
        auVar16._12_4_ = iVar83;
        auVar81._4_4_ = auVar53._4_4_;
        auVar81._0_4_ = auVar53._4_4_;
        auVar81._8_4_ = auVar53._12_4_;
        auVar81._12_4_ = auVar53._12_4_;
        auVar41 = auVar16 & auVar72 | auVar81;
        auVar41 = packssdw(auVar41,auVar41);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41 ^ auVar5,auVar41 ^ auVar5);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar34[-9].distance_from_desired = -1;
        }
        auVar41 = pshufhw(auVar41,auVar72,0x84);
        auVar17._4_4_ = iVar79;
        auVar17._0_4_ = iVar79;
        auVar17._8_4_ = iVar83;
        auVar17._12_4_ = iVar83;
        auVar42 = pshufhw(auVar53,auVar17,0x84);
        auVar61 = pshufhw(auVar41,auVar81,0x84);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar45 = (auVar61 | auVar42 & auVar41) ^ auVar45;
        auVar41 = packssdw(auVar45,auVar45);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._6_2_ >> 8 & 1) != 0) {
          psVar34[-8].distance_from_desired = -1;
        }
        auVar41 = (auVar58 | auVar25) ^ auVar40;
        auVar54._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
        auVar54._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
        auVar54._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
        auVar54._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
        auVar18._4_4_ = auVar54._0_4_;
        auVar18._0_4_ = auVar54._0_4_;
        auVar18._8_4_ = auVar54._8_4_;
        auVar18._12_4_ = auVar54._8_4_;
        auVar42 = pshuflw(auVar81,auVar18,0xe8);
        auVar46._0_4_ = -(uint)(auVar41._0_4_ == iVar60);
        auVar46._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
        auVar46._8_4_ = -(uint)(auVar41._8_4_ == iVar64);
        auVar46._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
        auVar73._4_4_ = auVar46._4_4_;
        auVar73._0_4_ = auVar46._4_4_;
        auVar73._8_4_ = auVar46._12_4_;
        auVar73._12_4_ = auVar46._12_4_;
        auVar41 = pshuflw(auVar46,auVar73,0xe8);
        auVar74._4_4_ = auVar54._4_4_;
        auVar74._0_4_ = auVar54._4_4_;
        auVar74._8_4_ = auVar54._12_4_;
        auVar74._12_4_ = auVar54._12_4_;
        auVar61 = pshuflw(auVar54,auVar74,0xe8);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar61 | auVar41 & auVar42) ^ auVar55;
        auVar61 = packssdw(auVar55,auVar55);
        auVar41 = packsswb(auVar41 & auVar42,auVar61);
        if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar34[-7].distance_from_desired = -1;
        }
        auVar19._4_4_ = auVar54._0_4_;
        auVar19._0_4_ = auVar54._0_4_;
        auVar19._8_4_ = auVar54._8_4_;
        auVar19._12_4_ = auVar54._8_4_;
        auVar74 = auVar73 & auVar19 | auVar74;
        auVar61 = packssdw(auVar74,auVar74);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar61 = packssdw(auVar61 ^ auVar6,auVar61 ^ auVar6);
        auVar41 = packsswb(auVar41,auVar61);
        if ((auVar41._8_2_ >> 8 & 1) != 0) {
          psVar34[-6].distance_from_desired = -1;
        }
        auVar41 = (auVar58 | auVar24) ^ auVar40;
        auVar56._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
        auVar56._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
        auVar56._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
        auVar56._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
        auVar75._4_4_ = auVar56._0_4_;
        auVar75._0_4_ = auVar56._0_4_;
        auVar75._8_4_ = auVar56._8_4_;
        auVar75._12_4_ = auVar56._8_4_;
        iVar79 = -(uint)(auVar41._4_4_ == iVar63);
        iVar83 = -(uint)(auVar41._12_4_ == iVar65);
        auVar20._4_4_ = iVar79;
        auVar20._0_4_ = iVar79;
        auVar20._8_4_ = iVar83;
        auVar20._12_4_ = iVar83;
        auVar82._4_4_ = auVar56._4_4_;
        auVar82._0_4_ = auVar56._4_4_;
        auVar82._8_4_ = auVar56._12_4_;
        auVar82._12_4_ = auVar56._12_4_;
        auVar41 = auVar20 & auVar75 | auVar82;
        auVar41 = packssdw(auVar41,auVar41);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41 ^ auVar7,auVar41 ^ auVar7);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar34[-5].distance_from_desired = -1;
        }
        auVar41 = pshufhw(auVar41,auVar75,0x84);
        auVar21._4_4_ = iVar79;
        auVar21._0_4_ = iVar79;
        auVar21._8_4_ = iVar83;
        auVar21._12_4_ = iVar83;
        auVar42 = pshufhw(auVar56,auVar21,0x84);
        auVar61 = pshufhw(auVar41,auVar82,0x84);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar47 = (auVar61 | auVar42 & auVar41) ^ auVar47;
        auVar41 = packssdw(auVar47,auVar47);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._10_2_ >> 8 & 1) != 0) {
          psVar34[-4].distance_from_desired = -1;
        }
        auVar41 = (auVar58 | _DAT_003e73f0) ^ auVar40;
        auVar57._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
        auVar57._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
        auVar57._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
        auVar57._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
        auVar22._4_4_ = auVar57._0_4_;
        auVar22._0_4_ = auVar57._0_4_;
        auVar22._8_4_ = auVar57._8_4_;
        auVar22._12_4_ = auVar57._8_4_;
        auVar42 = pshuflw(auVar82,auVar22,0xe8);
        auVar48._0_4_ = -(uint)(auVar41._0_4_ == iVar60);
        auVar48._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
        auVar48._8_4_ = -(uint)(auVar41._8_4_ == iVar64);
        auVar48._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
        auVar76._4_4_ = auVar48._4_4_;
        auVar76._0_4_ = auVar48._4_4_;
        auVar76._8_4_ = auVar48._12_4_;
        auVar76._12_4_ = auVar48._12_4_;
        auVar41 = pshuflw(auVar48,auVar76,0xe8);
        auVar77._4_4_ = auVar57._4_4_;
        auVar77._0_4_ = auVar57._4_4_;
        auVar77._8_4_ = auVar57._12_4_;
        auVar77._12_4_ = auVar57._12_4_;
        auVar61 = pshuflw(auVar57,auVar77,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41 & auVar42,(auVar61 | auVar41 & auVar42) ^ auVar8);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar34[-3].distance_from_desired = -1;
        }
        auVar23._4_4_ = auVar57._0_4_;
        auVar23._0_4_ = auVar57._0_4_;
        auVar23._8_4_ = auVar57._8_4_;
        auVar23._12_4_ = auVar57._8_4_;
        auVar77 = auVar76 & auVar23 | auVar77;
        auVar61 = packssdw(auVar77,auVar77);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41,auVar61 ^ auVar9);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._12_2_ >> 8 & 1) != 0) {
          psVar34[-2].distance_from_desired = -1;
        }
        auVar41 = (auVar58 | _DAT_003e73e0) ^ auVar40;
        auVar49._0_4_ = -(uint)(iVar60 < auVar41._0_4_);
        auVar49._4_4_ = -(uint)(iVar63 < auVar41._4_4_);
        auVar49._8_4_ = -(uint)(iVar64 < auVar41._8_4_);
        auVar49._12_4_ = -(uint)(iVar65 < auVar41._12_4_);
        auVar78._4_4_ = auVar49._0_4_;
        auVar78._0_4_ = auVar49._0_4_;
        auVar78._8_4_ = auVar49._8_4_;
        auVar78._12_4_ = auVar49._8_4_;
        auVar59._4_4_ = -(uint)(auVar41._4_4_ == iVar63);
        auVar59._12_4_ = -(uint)(auVar41._12_4_ == iVar65);
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar62._4_4_ = auVar49._4_4_;
        auVar62._0_4_ = auVar49._4_4_;
        auVar62._8_4_ = auVar49._12_4_;
        auVar62._12_4_ = auVar49._12_4_;
        auVar61 = auVar59 & auVar78 | auVar62;
        auVar41 = packssdw(auVar49,auVar61);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar41 = packssdw(auVar41 ^ auVar10,auVar41 ^ auVar10);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar34[-1].distance_from_desired = -1;
        }
        auVar41 = pshufhw(auVar41,auVar78,0x84);
        in_XMM2 = pshufhw(auVar61,auVar59,0x84);
        in_XMM2 = in_XMM2 & auVar41;
        auVar41 = pshufhw(auVar41,auVar62,0x84);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar41 | in_XMM2) ^ auVar50;
        auVar41 = packssdw(auVar50,auVar50);
        auVar41 = packsswb(auVar41,auVar41);
        if ((auVar41._14_2_ >> 8 & 1) != 0) {
          psVar34->distance_from_desired = -1;
        }
        lVar35 = lVar35 + 0x10;
        psVar34 = psVar34 + 0x10;
      } while ((uVar32 - ((uint)uVar37 & 0xf)) + 0x10 != lVar35);
    }
    psVar33[local_38 + ((ulong)bVar36 - 1)].distance_from_desired = '\0';
    begin = this->entries;
    sVar31 = this->num_slots_minus_one;
    this->entries = psVar33;
    this->num_slots_minus_one = local_38 - 1;
    (this->hash_policy).shift = iVar30;
    max_lookups = this->max_lookups;
    this->max_lookups = bVar36;
    this->num_elements = 0;
    local_38 = sVar31;
    if (begin != begin + sVar31 + (long)max_lookups) {
      key = &begin->field_1;
      lVar35 = sVar31 * 0x10 + (long)max_lookups * 0x10;
      do {
        if (-1 < ((sherwood_v3_entry<const_slang::syntax::SyntaxNode_*> *)(key + -1))->
                 distance_from_desired) {
          sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
          ::emplace<slang::syntax::SyntaxNode_const*>
                    ((sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                      *)this,&key->value);
          ((sherwood_v3_entry<const_slang::syntax::SyntaxNode_*> *)(key + -1))->
          distance_from_desired = -1;
        }
        key = key + 2;
        lVar35 = lVar35 + -0x10;
      } while (lVar35 != 0);
    }
    deallocate_data(this,begin,local_38,max_lookups);
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }